

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_Layer * __thiscall
ON_ClassArray<ON_Layer>::SetCapacity(ON_ClassArray<ON_Layer> *this,size_t new_capacity)

{
  undefined8 uVar1;
  int local_2c;
  int local_1c;
  int capacity;
  int i;
  size_t new_capacity_local;
  ON_ClassArray<ON_Layer> *this_local;
  
  if (*(int *)(this + 0x14) == 0) {
    *(undefined8 *)(this + 8) = 0;
    *(undefined4 *)(this + 0x10) = 0;
  }
  if ((new_capacity == 0) || (0xfffffffe < new_capacity)) {
    local_2c = 0;
  }
  else {
    local_2c = (int)new_capacity;
  }
  if (local_2c < 1) {
    if (*(long *)(this + 8) != 0) {
      local_1c = *(int *)(this + 0x14);
      while (local_1c = local_1c + -1, -1 < local_1c) {
        DestroyElement(this,(ON_Layer *)(*(long *)(this + 8) + (long)local_1c * 0xe8));
      }
      (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),0);
      *(undefined8 *)(this + 8) = 0;
    }
    *(undefined4 *)(this + 0x10) = 0;
    *(undefined4 *)(this + 0x14) = 0;
  }
  else if (*(int *)(this + 0x14) < local_2c) {
    uVar1 = (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),local_2c);
    *(undefined8 *)(this + 8) = uVar1;
    if (*(long *)(this + 8) == 0) {
      *(undefined4 *)(this + 0x14) = 0;
      *(undefined4 *)(this + 0x10) = 0;
    }
    else {
      memset((void *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 0xe8),0,
             (long)(local_2c - *(int *)(this + 0x14)) * 0xe8);
      for (local_1c = *(int *)(this + 0x14); local_1c < local_2c; local_1c = local_1c + 1) {
        ConstructDefaultElement(this,(ON_Layer *)(*(long *)(this + 8) + (long)local_1c * 0xe8));
      }
      *(int *)(this + 0x14) = local_2c;
    }
  }
  else if (local_2c < *(int *)(this + 0x14)) {
    local_1c = *(int *)(this + 0x14);
    while (local_1c = local_1c + -1, local_2c <= local_1c) {
      DestroyElement(this,(ON_Layer *)(*(long *)(this + 8) + (long)local_1c * 0xe8));
    }
    if (local_2c < *(int *)(this + 0x10)) {
      *(int *)(this + 0x10) = local_2c;
    }
    *(int *)(this + 0x14) = local_2c;
    uVar1 = (**(code **)(*(long *)this + 0x20))(this,*(undefined8 *)(this + 8),local_2c);
    *(undefined8 *)(this + 8) = uVar1;
    if (*(long *)(this + 8) == 0) {
      *(undefined4 *)(this + 0x14) = 0;
      *(undefined4 *)(this + 0x10) = 0;
    }
  }
  return *(ON_Layer **)(this + 8);
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}